

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

void __thiscall Liby::http::Request::print(Request *this)

{
  Logger *pLVar1;
  __node_base *p_Var2;
  double __x;
  double __x_00;
  double __x_01;
  
  pLVar1 = Logger::getLogger();
  Logger::log(pLVar1,__x);
  pLVar1 = Logger::getLogger();
  Logger::log(pLVar1,__x_00);
  p_Var2 = &(this->headers_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pLVar1 = Logger::getLogger();
    Logger::log(pLVar1,__x_01);
  }
  return;
}

Assistant:

void Request::print() {
    info("uri: %s", uri_.data());
    info("query: %s", query_.data());
    for (auto &x : headers_) {
        info("%s: %s", x.first.data(), x.second.data());
    }
}